

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O1

Vector3D * __thiscall
CMU462::DynamicScene::Joint::getAngle(Vector3D *__return_storage_ptr__,Joint *this,double time)

{
  _Base_ptr p_Var1;
  
  if ((this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      0) {
    p_Var1 = *(_Base_ptr *)
              ((long)&(this->super_SceneObject).rotations.knots._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    __return_storage_ptr__->x = (double)p_Var1[1]._M_parent;
    __return_storage_ptr__->y = (double)p_Var1[1]._M_left;
    __return_storage_ptr__->z = (double)p_Var1[1]._M_right;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  return __return_storage_ptr__;
}

Assistant:

Vector3D Joint::getAngle( double time )
   {
      return rotations(time);
   }